

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timestamp.cpp
# Opt level: O2

TimestampCastResult
duckdb::Timestamp::TryConvertTimestampTZ
          (char *str,idx_t len,timestamp_t *result,bool *has_offset,string_t *tz,
          optional_ptr<int,_true> nanos)

{
  char *pcVar1;
  DateCastResult DVar2;
  bool bVar3;
  int64_t iVar4;
  long lVar5;
  uint uVar6;
  idx_t iVar7;
  ulong uVar8;
  ulong uVar9;
  char *__src;
  date_t date;
  int ss;
  int mm;
  int hh;
  idx_t time_pos;
  dtime_t time;
  idx_t local_70;
  date_t local_64;
  undefined4 local_60;
  undefined4 uStack_5c;
  undefined4 local_58;
  int local_54;
  int local_50;
  int local_4c;
  string_t *local_48;
  idx_t local_40;
  dtime_t local_38;
  
  *has_offset = false;
  DVar2 = Date::TryConvertDate(str,len,&local_70,&local_64,has_offset,false);
  if (DVar2 != ERROR_INCORRECT_FORMAT) {
    if (DVar2 == ERROR_RANGE) {
      DVar2 = ERROR_RANGE|ERROR_INCORRECT_FORMAT;
    }
    else {
      local_48 = tz;
      if (local_70 == len) {
        if (local_64.days == -0x7fffffff) {
          iVar4 = -0x7fffffffffffffff;
        }
        else {
          if (local_64.days != 0x7fffffff) {
            bVar3 = TryFromDatetime(local_64,(dtime_t)0x0,result);
            return !bVar3 * '\x03';
          }
          iVar4 = 0x7fffffffffffffff;
        }
        result->value = iVar4;
      }
      else {
        if ((str[local_70] == 'T') || (iVar7 = local_70, str[local_70] == ' ')) {
          iVar7 = local_70 + 1;
        }
        local_40 = 0;
        bVar3 = Time::TryConvertInternal(str + iVar7,len - iVar7,&local_40,&local_38,false,nanos);
        if (!bVar3) {
          return ERROR_INCORRECT_FORMAT;
        }
        if (86400000000 < local_38.micros) {
          return ERROR_RANGE;
        }
        uVar8 = iVar7 + local_40;
        local_70 = uVar8;
        bVar3 = TryFromDatetime(local_64,local_38,result);
        if (!bVar3) {
          return ERROR_RANGE;
        }
        if (uVar8 < len) {
          if (str[uVar8] == 'Z') {
            *has_offset = true;
            uVar8 = uVar8 + 1;
          }
          else {
            bVar3 = TryParseUTCOffset(str,&local_70,len,&local_4c,&local_50,&local_54);
            if (bVar3) {
              bVar3 = TrySubtractOperator::Operation<long,long,long>
                                (result->value,
                                 (long)local_54 * 1000000 +
                                 (long)local_50 * 60000000 + (long)local_4c * 3600000000,
                                 &result->value);
              if (!bVar3) {
                return ERROR_RANGE;
              }
              *has_offset = true;
              uVar8 = local_70;
            }
            else {
              if (str[local_70] != ' ') {
                return ERROR_NON_UTC_TIMEZONE;
              }
              uVar8 = local_70 + 1;
              __src = str + uVar8;
              lVar5 = 0;
              uVar9 = uVar8;
              while ((uVar9 < len && (bVar3 = CharacterIsTimeZone(str[uVar9]), bVar3))) {
                uVar9 = uVar9 + 1;
                lVar5 = lVar5 + -1;
              }
              if (lVar5 != 0) {
                uVar6 = -(int)lVar5;
                if (uVar6 < 0xd) {
                  local_58 = 0;
                  local_60 = 0;
                  uStack_5c = 0;
                  pcVar1 = (char *)0x0;
                  if ((int)lVar5 != 0) {
                    switchD_016b0717::default(&local_60,__src,(ulong)(uVar6 & 0xf));
                    pcVar1 = (char *)CONCAT44(local_58,uStack_5c);
                  }
                }
                else {
                  local_60 = *(undefined4 *)__src;
                  pcVar1 = __src;
                }
                local_58 = (undefined4)((ulong)pcVar1 >> 0x20);
                uStack_5c = SUB84(pcVar1,0);
                (local_48->value).pointer.length = uVar6;
                *(ulong *)((long)&local_48->value + 4) = CONCAT44(uStack_5c,local_60);
                *(undefined4 *)((long)&local_48->value + 0xc) = local_58;
                uVar8 = uVar9;
              }
            }
          }
          for (; uVar8 < len; uVar8 = uVar8 + 1) {
            if ((0x20 < (ulong)(byte)str[uVar8]) ||
               ((0x100003e00U >> ((ulong)(byte)str[uVar8] & 0x3f) & 1) == 0)) {
              return ERROR_INCORRECT_FORMAT;
            }
          }
        }
      }
      DVar2 = SUCCESS;
    }
  }
  return DVar2;
}

Assistant:

TimestampCastResult Timestamp::TryConvertTimestampTZ(const char *str, idx_t len, timestamp_t &result, bool &has_offset,
                                                     string_t &tz, optional_ptr<int32_t> nanos) {
	idx_t pos;
	date_t date;
	dtime_t time;
	has_offset = false;
	switch (Date::TryConvertDate(str, len, pos, date, has_offset)) {
	case DateCastResult::ERROR_INCORRECT_FORMAT:
		return TimestampCastResult::ERROR_INCORRECT_FORMAT;
	case DateCastResult::ERROR_RANGE:
		return TimestampCastResult::ERROR_RANGE;
	default:
		break;
	}
	if (pos == len) {
		// no time: only a date or special
		if (date == date_t::infinity()) {
			result = timestamp_t::infinity();
			return TimestampCastResult::SUCCESS;
		} else if (date == date_t::ninfinity()) {
			result = timestamp_t::ninfinity();
			return TimestampCastResult::SUCCESS;
		}
		return Timestamp::TryFromDatetime(date, dtime_t(0), result) ? TimestampCastResult::SUCCESS
		                                                            : TimestampCastResult::ERROR_RANGE;
	}
	// try to parse a time field
	if (str[pos] == ' ' || str[pos] == 'T') {
		pos++;
	}
	idx_t time_pos = 0;
	// TryConvertTime may recursively call us, so we opt for a stricter
	// operation. Note that we can't pass strict== true here because we
	// want to process any suffix.
	if (!Time::TryConvertInterval(str + pos, len - pos, time_pos, time, false, nanos)) {
		return TimestampCastResult::ERROR_INCORRECT_FORMAT;
	}
	//	We parsed an interval, so make sure it is in range.
	if (time.micros > Interval::MICROS_PER_DAY) {
		return TimestampCastResult::ERROR_RANGE;
	}
	pos += time_pos;
	if (!Timestamp::TryFromDatetime(date, time, result)) {
		return TimestampCastResult::ERROR_RANGE;
	}
	if (pos < len) {
		// skip a "Z" at the end (as per the ISO8601 specs)
		int hh, mm, ss;
		if (str[pos] == 'Z') {
			pos++;
			has_offset = true;
		} else if (Timestamp::TryParseUTCOffset(str, pos, len, hh, mm, ss)) {
			const int64_t delta =
			    hh * Interval::MICROS_PER_HOUR + mm * Interval::MICROS_PER_MINUTE + ss * Interval::MICROS_PER_SEC;
			if (!TrySubtractOperator::Operation(result.value, delta, result.value)) {
				return TimestampCastResult::ERROR_RANGE;
			}
			has_offset = true;
		} else {
			// Parse a time zone: / [A-Za-z0-9/_]+/
			if (str[pos++] != ' ') {
				return TimestampCastResult::ERROR_NON_UTC_TIMEZONE;
			}
			auto tz_name = str + pos;
			for (; pos < len && CharacterIsTimeZone(str[pos]); ++pos) {
				continue;
			}
			auto tz_len = str + pos - tz_name;
			if (tz_len) {
				tz = string_t(tz_name, UnsafeNumericCast<uint32_t>(tz_len));
			}
			// Note that the caller must reinterpret the instant we return to the given time zone
		}

		// skip any spaces at the end
		while (pos < len && StringUtil::CharacterIsSpace(str[pos])) {
			pos++;
		}
		if (pos < len) {
			return TimestampCastResult::ERROR_INCORRECT_FORMAT;
		}
	}
	return TimestampCastResult::SUCCESS;
}